

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_mon_spell_message_type(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *name;
  
  pvVar3 = parser_priv(p);
  name = parser_getsym(p,"type");
  iVar1 = message_lookup_by_name(name);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (iVar1 < 0) {
    pVar2 = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    *(int *)((long)pvVar3 + 0xc) = iVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_mon_spell_message_type(struct parser *p)
{
	struct monster_spell *s = parser_priv(p);
	const char *type = parser_getsym(p, "type");
	int msg_index = message_lookup_by_name(type);

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (msg_index < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	s->msgt = msg_index;
	return PARSE_ERROR_NONE;
}